

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsCreateContext(JsRuntimeHandle runtimeHandle,JsContextRef *newContext)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  bool activelyRecording;
  bool bVar3;
  JsErrorCode exitStatus;
  JsrtRuntime *pJVar4;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  bool inReplayMode;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_38 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_38 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (newContext == (JsContextRef *)0x0) {
    exitStatus = JsErrorNullArgument;
    goto LAB_0035ed77;
  }
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    exitStatus = JsErrorInvalidArgument;
    goto LAB_0035ed77;
  }
  pJVar4 = JsrtRuntime::FromHandle(runtimeHandle);
  pTVar1 = pJVar4->threadContext;
  if (pTVar1->TTDLog == (EventLog *)0x0) {
LAB_0035eceb:
    inReplayMode = false;
    activelyRecording = false;
    bVar3 = false;
  }
  else {
    pSVar5 = TTD::ThreadContextTTD::GetActiveScriptContext(pTVar1->TTDContext);
    if (pSVar5 == (ScriptContext *)0x0) goto LAB_0035eceb;
    pSVar5 = TTD::ThreadContextTTD::GetActiveScriptContext(pTVar1->TTDContext);
    bVar3 = pSVar5->TTDRecordModeEnabled;
    inReplayMode = pSVar5->TTDReplayModeEnabled;
    activelyRecording = pSVar5->TTDShouldPerformRecordAction;
  }
  exitStatus = CreateContextCore(runtimeHandle,(TTDRecorder *)auStack_38,bVar3,activelyRecording,
                                 inReplayMode,newContext);
  if ((exitStatus - JsErrorNoCurrentContext < 7) &&
     ((0x43U >> (exitStatus - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0x89,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
LAB_0035ed77:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)auStack_38,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsCreateContext(_In_ JsRuntimeHandle runtimeHandle, _Out_ JsContextRef *newContext)
{
    return GlobalAPIWrapper([&](TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PARAM_NOT_NULL(newContext);
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        bool inRecord = false;
        bool activelyRecording = false;
        bool inReplay = false;

#if ENABLE_TTD
        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
        ThreadContext * threadContext = runtime->GetThreadContext();
        if(threadContext->IsRuntimeInTTDMode() && threadContext->TTDContext->GetActiveScriptContext() != nullptr)
        {
            Js::ScriptContext* currentCtx = threadContext->TTDContext->GetActiveScriptContext();
            inRecord = currentCtx->IsTTDRecordModeEnabled();
            activelyRecording = currentCtx->ShouldPerformRecordAction();
            inReplay = currentCtx->IsTTDReplayModeEnabled();
        }
#endif

        return CreateContextCore(runtimeHandle, _actionEntryPopper, inRecord, activelyRecording, inReplay, newContext);
    });
}